

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_fortran.h
# Opt level: O2

void mpiabi_alltoallv_(void *sendbuf,int *sendcounts,int *sdispls,MPIABI_Fint *sendtype,
                      void *recvbuf,int *recvcounts,int *rdispls,MPIABI_Fint *recvtype,
                      MPIABI_Fint *comm,MPIABI_Fint *ierror)

{
  mpi_alltoallv_();
  return;
}

Assistant:

void mpiabi_alltoallv_(
  const void * sendbuf,
  const int * sendcounts,
  const int * sdispls,
  const MPIABI_Fint * sendtype,
  void * recvbuf,
  const int * recvcounts,
  const int * rdispls,
  const MPIABI_Fint * recvtype,
  const MPIABI_Fint * comm,
  MPIABI_Fint * ierror
) {
  return mpi_alltoallv_(
    sendbuf,
    sendcounts,
    sdispls,
    sendtype,
    recvbuf,
    recvcounts,
    rdispls,
    recvtype,
    comm,
    ierror
  );
}